

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSAtom js_atom_concat_str(JSContext *ctx,JSAtom name,char *str1)

{
  int iVar1;
  JSAtom JVar2;
  JSValueUnion JVar3;
  char *ptr;
  size_t __n;
  char *str;
  uint uVar4;
  JSValue val1;
  size_t len;
  size_t local_48;
  JSValueUnion local_40;
  char *local_38;
  
  val1 = __JS_AtomToValue(ctx,name,1);
  JVar3 = val1.u;
  uVar4 = (uint)val1.tag;
  if (uVar4 != 6) {
    local_38 = str1;
    ptr = JS_ToCStringLen2(ctx,&local_48,val1,0);
    local_40 = JVar3;
    if (ptr != (char *)0x0) {
      __n = strlen(local_38);
      str = (char *)js_malloc(ctx,local_48 + __n + 1);
      if (str != (char *)0x0) {
        memcpy(str,ptr,local_48);
        memcpy(str + local_48,local_38,__n);
        str[__n + local_48] = '\0';
        JVar2 = JS_NewAtomLen(ctx,str,__n + local_48);
        (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,str);
        JS_FreeCString(ctx,ptr);
        if (uVar4 < 0xfffffff5) {
          return JVar2;
        }
        iVar1 = *JVar3.ptr;
        *(int *)JVar3.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          __JS_FreeValueRT(ctx->rt,val1);
          return JVar2;
        }
        return JVar2;
      }
    }
    JS_FreeCString(ctx,ptr);
    if ((0xfffffff4 < uVar4) && (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,val1);
    }
  }
  return 0;
}

Assistant:

static JSAtom js_atom_concat_str(JSContext *ctx, JSAtom name, const char *str1)
{
    JSValue str;
    JSAtom atom;
    const char *cstr;
    char *cstr2;
    size_t len, len1;
    
    str = JS_AtomToString(ctx, name);
    if (JS_IsException(str))
        return JS_ATOM_NULL;
    cstr = JS_ToCStringLen(ctx, &len, str);
    if (!cstr)
        goto fail;
    len1 = strlen(str1);
    cstr2 = js_malloc(ctx, len + len1 + 1);
    if (!cstr2)
        goto fail;
    memcpy(cstr2, cstr, len);
    memcpy(cstr2 + len, str1, len1);
    cstr2[len + len1] = '\0';
    atom = JS_NewAtomLen(ctx, cstr2, len + len1);
    js_free(ctx, cstr2);
    JS_FreeCString(ctx, cstr);
    JS_FreeValue(ctx, str);
    return atom;
 fail:
    JS_FreeCString(ctx, cstr);
    JS_FreeValue(ctx, str);
    return JS_ATOM_NULL;
}